

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::initializeSpecialStreams(QPDFWriter *this)

{
  element_type *peVar1;
  key_type __k;
  key_type kVar2;
  pointer pQVar3;
  bool bVar4;
  int iVar5;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  mapped_type *pmVar6;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__range2;
  int iVar7;
  QPDFObjGen *c;
  int iVar8;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> contents_objects;
  QPDFObjectHandle contents;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> local_a8;
  QPDFObjectHandle local_80;
  string *local_70;
  string *local_68;
  QPDFObjGen local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFObjGen local_50;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  __x = QPDF::getAllPages(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_48,__x);
  local_68 = (string *)
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar7 = 0;
    do {
      peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70 = (string *)
                 local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)QPDFObjectHandle::getObjGen
                              (local_48.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      pmVar6 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&peVar1->page_object_to_seq,(key_type *)&local_a8);
      iVar7 = iVar7 + 1;
      *pmVar6 = iVar7;
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Contents","");
      QPDFObjectHandle::getKey(&local_80,local_70);
      if (local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (ulong)((long)&(local_a8.
                                        super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage)->obj + 1)
                       );
      }
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = QPDFObjectHandle::isArray(&local_80);
      if (bVar4) {
        iVar5 = QPDFObjectHandle::getArrayNItems(&local_80);
        __k = (key_type)
              local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
              super__Vector_impl_data._M_start;
        kVar2 = (key_type)
                local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (0 < iVar5) {
          iVar8 = 0;
          do {
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_60,(int)&local_80);
            local_50 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_60);
            std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::emplace_back<QPDFObjGen>
                      (&local_a8,&local_50);
            if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
            }
            iVar8 = iVar8 + 1;
            __k = (key_type)
                  local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_start;
            kVar2 = (key_type)
                    local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          } while (iVar5 != iVar8);
        }
      }
      else {
        bVar4 = QPDFObjectHandle::isStream(&local_80);
        __k = (key_type)
              local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
              super__Vector_impl_data._M_start;
        kVar2 = (key_type)
                local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar4) {
          local_60 = QPDFObjectHandle::getObjGen(&local_80);
          std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::emplace_back<QPDFObjGen>
                    (&local_a8,&local_60);
          __k = (key_type)
                local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                super__Vector_impl_data._M_start;
          kVar2 = (key_type)
                  local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        }
      }
      for (; pQVar3 = local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                      super__Vector_impl_data._M_finish,
          __k != (key_type)
                 local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_finish; __k = (key_type)((long)__k + 8)) {
        local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)kVar2;
        pmVar6 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](&((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->contents_to_page_seq,(key_type *)__k);
        *pmVar6 = iVar7;
        std::
        _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
        ::_M_insert_unique<QPDFObjGen_const&>
                  ((_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                    *)&((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->normalized_streams,(QPDFObjGen *)__k);
        kVar2 = (key_type)
                local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                super__Vector_impl_data._M_finish;
        local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_finish = pQVar3;
      }
      local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)kVar2;
      if ((key_type)
          local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
          super__Vector_impl_data._M_start != (key_type)0x0) {
        operator_delete(local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_70->field_2;
    } while ((string *)
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start != local_68);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
  return;
}

Assistant:

void
QPDFWriter::initializeSpecialStreams()
{
    // Mark all page content streams in case we are filtering or normalizing.
    std::vector<QPDFObjectHandle> pages = m->pdf.getAllPages();
    int num = 0;
    for (auto& page: pages) {
        m->page_object_to_seq[page.getObjGen()] = ++num;
        QPDFObjectHandle contents = page.getKey("/Contents");
        std::vector<QPDFObjGen> contents_objects;
        if (contents.isArray()) {
            int n = contents.getArrayNItems();
            for (int i = 0; i < n; ++i) {
                contents_objects.push_back(contents.getArrayItem(i).getObjGen());
            }
        } else if (contents.isStream()) {
            contents_objects.push_back(contents.getObjGen());
        }

        for (auto const& c: contents_objects) {
            m->contents_to_page_seq[c] = num;
            m->normalized_streams.insert(c);
        }
    }
}